

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_resolveWithMissingChildUnits_Test::Importer_resolveWithMissingChildUnits_Test
          (Importer_resolveWithMissingChildUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00168618;
  return;
}

Assistant:

TEST(Importer, resolveWithMissingChildUnits)
{
    std::string e = "Import of units 'units1' from '" + resourcePath("importer/") + "units_children.cellml' requires units named 'units_with_imaginary_children', which relies on child units named 'I_dont_exist', which cannot be found.";
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/importing_units_with_missing_children.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}